

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_coc(opj_j2k_t *j2k)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long in_RDI;
  opj_j2k_t *unaff_retaddr;
  opj_cio_t *cio;
  opj_image_t *image;
  opj_tcp_t *tcp;
  opj_cp_t *cp;
  int compno;
  int len;
  long lVar4;
  opj_cio_t *cio_00;
  int compno_00;
  int n;
  
  if (*(int *)(in_RDI + 8) == 0x10) {
    lVar3 = *(long *)(*(long *)(in_RDI + 0x60) + 0x80) + (long)*(int *)(in_RDI + 0xc) * 0x15e8;
  }
  else {
    lVar3 = *(long *)(in_RDI + 0x50);
  }
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  lVar4 = lVar3;
  cio_read(cio_00,(int)((ulong)lVar3 >> 0x20));
  n = (int)((ulong)lVar4 >> 0x20);
  compno_00 = (int)((ulong)in_RDI >> 0x20);
  uVar1 = cio_read(cio_00,n);
  uVar2 = cio_read(cio_00,n);
  *(uint *)(*(long *)(lVar3 + 0x15e0) + (long)(int)uVar1 * 0x438) = uVar2;
  j2k_read_cox(unaff_retaddr,compno_00);
  return;
}

Assistant:

static void j2k_read_coc(opj_j2k_t *j2k) {
	int len, compno;

	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = j2k->state == J2K_STATE_TPH ? &cp->tcps[j2k->curtileno] : j2k->default_tcp;
	opj_image_t *image = j2k->image;
	opj_cio_t *cio = j2k->cio;
	
	len = cio_read(cio, 2);		/* Lcoc */
	compno = cio_read(cio, image->numcomps <= 256 ? 1 : 2);	/* Ccoc */
	tcp->tccps[compno].csty = cio_read(cio, 1);	/* Scoc */
	j2k_read_cox(j2k, compno);
}